

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O3

int VP8IteratorNext(VP8EncIterator *it)

{
  int iVar1;
  
  iVar1 = it->x_ + 1;
  it->x_ = iVar1;
  if (iVar1 == it->enc_->mb_w_) {
    iVar1 = it->y_ + 1;
    it->y_ = iVar1;
    VP8IteratorSetRow(it,iVar1);
  }
  else {
    it->mb_ = it->mb_ + 1;
    it->preds_ = it->preds_ + 4;
    it->nz_ = it->nz_ + 1;
    it->y_top_ = it->y_top_ + 0x10;
    it->uv_top_ = it->uv_top_ + 0x10;
  }
  iVar1 = it->count_down_;
  it->count_down_ = iVar1 + -1;
  return (uint)(1 < iVar1);
}

Assistant:

int VP8IteratorNext(VP8EncIterator* const it) {
  if (++it->x_ == it->enc_->mb_w_) {
    VP8IteratorSetRow(it, ++it->y_);
  } else {
    it->preds_ += 4;
    it->mb_ += 1;
    it->nz_ += 1;
    it->y_top_ += 16;
    it->uv_top_ += 16;
  }
  return (0 < --it->count_down_);
}